

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

void __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Empty(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  CPreparatoryFunction *__ptr;
  int iVar1;
  long lVar2;
  default_delete<Refal2::CPreparatoryFunction> *this_00;
  long lVar3;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&(this->keyToIndex)._M_t);
  iVar1 = this->size;
  if (0 < iVar1) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      __ptr = *(CPreparatoryFunction **)((long)&(this->keyDataPairs->key)._M_node + lVar3);
      this_00 = (default_delete<Refal2::CPreparatoryFunction> *)
                ((long)&(this->keyDataPairs->key)._M_node + lVar3);
      if (__ptr != (CPreparatoryFunction *)0x0) {
        std::default_delete<Refal2::CPreparatoryFunction>::operator()(this_00,__ptr);
        iVar1 = this->size;
      }
      *(undefined8 *)this_00 = 0;
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < iVar1);
  }
  this->size = 0;
  return;
}

Assistant:

void CDictionary<Data, Key>::Empty()
{
	keyToIndex.clear();
	for( int i = 0; i < size; i++ ) {
		keyDataPairs[i].~CKeyDataPair();
	}
	size = 0;
}